

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

void Io_WriteVerilogRegs(FILE *pFile,Abc_Ntk_t *pNtk,int Start)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int local_44;
  int nNodes;
  int Counter;
  int i;
  int NameCounter;
  int AddedLength;
  int LineLength;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pLatch;
  int Start_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  local_44 = 0;
  Counter = 0;
  NameCounter = Start;
  for (nNodes = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), nNodes < iVar2; nNodes = nNodes + 1) {
    pAVar3 = Abc_NtkBox(pNtk,nNodes);
    iVar2 = Abc_ObjIsLatch(pAVar3);
    if (iVar2 != 0) {
      pAVar3 = Abc_ObjFanout0(pAVar3);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      local_44 = local_44 + 1;
      pcVar4 = Abc_ObjName(pAVar3);
      pcVar4 = Io_WriteVerilogGetName(pcVar4);
      sVar5 = strlen(pcVar4);
      iVar2 = (int)sVar5 + 2;
      if ((Counter != 0) && (0x4e < NameCounter + iVar2 + 3)) {
        fprintf((FILE *)pFile,"\n   ");
        NameCounter = 3;
        Counter = 0;
      }
      pcVar4 = Abc_ObjName(pAVar3);
      pcVar4 = Io_WriteVerilogGetName(pcVar4);
      pcVar6 = ",";
      if (local_44 == iVar1) {
        pcVar6 = "";
      }
      fprintf((FILE *)pFile," %s%s",pcVar4,pcVar6);
      NameCounter = iVar2 + NameCounter;
      Counter = Counter + 1;
    }
  }
  return;
}

Assistant:

void Io_WriteVerilogRegs( FILE * pFile, Abc_Ntk_t * pNtk, int Start )
{
    Abc_Obj_t * pLatch, * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    int i, Counter, nNodes;

    // count the number of latches
    nNodes = Abc_NtkLatchNum(pNtk);

    // write the wires
    Counter = 0;
    LineLength  = Start;
    NameCounter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pNet = Abc_ObjFanout0(Abc_ObjFanout0(pLatch));
        Counter++;
        // get the line length after this name is written
        AddedLength = strlen(Io_WriteVerilogGetName(Abc_ObjName(pNet))) + 2;
        if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
        { // write the line extender
            fprintf( pFile, "\n   " );
            // reset the line length
            LineLength  = 3;
            NameCounter = 0;
        }
        fprintf( pFile, " %s%s", Io_WriteVerilogGetName(Abc_ObjName(pNet)), (Counter==nNodes)? "" : "," );
        LineLength += AddedLength;
        NameCounter++;
    }
}